

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

int mbedtls_sha1_self_test(int verbose)

{
  int iVar1;
  undefined1 local_4a4 [8];
  mbedtls_sha1_context ctx;
  uchar sha1sum [20];
  uchar local_428 [8];
  uchar buf [1024];
  int local_1c;
  int ret;
  int buflen;
  int j;
  int i;
  int verbose_local;
  
  local_1c = 0;
  mbedtls_sha1_init((mbedtls_sha1_context *)local_4a4);
  buflen = 0;
  do {
    if (2 < buflen) {
      if (verbose != 0) {
        printf(anon_var_dwarf_298b23 + 8);
      }
LAB_0026f1fe:
      mbedtls_sha1_free((mbedtls_sha1_context *)local_4a4);
      return local_1c;
    }
    if (verbose != 0) {
      printf("  SHA-1 test #%d: ",(ulong)(buflen + 1));
    }
    mbedtls_sha1_starts((mbedtls_sha1_context *)local_4a4);
    if (buflen == 2) {
      memset(local_428,0x61,1000);
      for (ret = 0; ret < 1000; ret = ret + 1) {
        mbedtls_sha1_update((mbedtls_sha1_context *)local_4a4,local_428,1000);
      }
    }
    else {
      mbedtls_sha1_update((mbedtls_sha1_context *)local_4a4,sha1_test_buf[buflen],
                          (long)sha1_test_buflen[buflen]);
    }
    mbedtls_sha1_finish((mbedtls_sha1_context *)local_4a4,ctx.buffer + 0x38);
    iVar1 = memcmp(ctx.buffer + 0x38,sha1_test_sum + buflen,0x14);
    if (iVar1 != 0) {
      if (verbose != 0) {
        printf("failed\n");
      }
      local_1c = 1;
      goto LAB_0026f1fe;
    }
    if (verbose != 0) {
      printf("passed\n");
    }
    buflen = buflen + 1;
  } while( true );
}

Assistant:

int mbedtls_sha1_self_test( int verbose )
{
    int i, j, buflen, ret = 0;
    unsigned char buf[1024];
    unsigned char sha1sum[20];
    mbedtls_sha1_context ctx;

    mbedtls_sha1_init( &ctx );

    /*
     * SHA-1
     */
    for( i = 0; i < 3; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  SHA-1 test #%d: ", i + 1 );

        mbedtls_sha1_starts( &ctx );

        if( i == 2 )
        {
            memset( buf, 'a', buflen = 1000 );

            for( j = 0; j < 1000; j++ )
                mbedtls_sha1_update( &ctx, buf, buflen );
        }
        else
            mbedtls_sha1_update( &ctx, sha1_test_buf[i],
                               sha1_test_buflen[i] );

        mbedtls_sha1_finish( &ctx, sha1sum );

        if( memcmp( sha1sum, sha1_test_sum[i], 20 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_sha1_free( &ctx );

    return( ret );
}